

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O3

_Bool plutovg_surface_write_to_png(plutovg_surface_t *surface,char *filename)

{
  undefined8 in_RAX;
  uchar *__ptr;
  FILE *__s;
  int *in_R9;
  _Bool _Var1;
  int len;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  plutovg_convert_argb_to_rgba
            (surface->data,surface->data,surface->width,surface->height,surface->stride);
  __ptr = stbi_write_png_to_mem
                    (surface->data,surface->stride,surface->width,surface->height,(int)&local_24,
                     in_R9);
  if (__ptr == (uchar *)0x0) {
    _Var1 = false;
  }
  else {
    __s = fopen(filename,"wb");
    _Var1 = __s != (FILE *)0x0;
    if (_Var1) {
      fwrite(__ptr,1,(long)local_24,__s);
      fclose(__s);
    }
    free(__ptr);
  }
  plutovg_convert_rgba_to_argb
            (surface->data,surface->data,surface->width,surface->height,surface->stride);
  return _Var1;
}

Assistant:

bool plutovg_surface_write_to_png(const plutovg_surface_t* surface, const char* filename)
{
    plutovg_surface_write_begin(surface);
    int success = stbi_write_png(filename, surface->width, surface->height, 4, surface->data, surface->stride);
    plutovg_surface_write_end(surface);
    return success;
}